

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

uint32_t kratos::SortInitialVisitor::get_order(shared_ptr<kratos::Stmt> *stmt)

{
  uint32_t uVar1;
  undefined1 local_20 [8];
  shared_ptr<kratos::StmtBlock> block;
  
  uVar1 = 0;
  if (((stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ == Block)
  {
    Stmt::as<kratos::StmtBlock>((Stmt *)local_20);
    uVar1 = (uint32_t)(*(int *)((long)local_20 + 0xd8) == 4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&block);
  }
  return uVar1;
}

Assistant:

static uint32_t get_order(const std::shared_ptr<Stmt>& stmt) {
        if (stmt->type() != StatementType::Block) return 0;
        auto block = stmt->as<StmtBlock>();
        if (block->block_type() != StatementBlockType::Initial) return 0;
        return 1;
    }